

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O2

void __thiscall
gl4cts::ShaderSubroutine::NegativeTest3::executeTest
          (NegativeTest3 *this,_shader_stage *shader_stage)

{
  ostringstream *this_00;
  code *pcVar1;
  int iVar2;
  GLenum GVar3;
  GLuint GVar4;
  deUint32 dVar5;
  undefined4 extraout_var;
  TestError *this_01;
  NegativeTest3 *this_02;
  GLint compile_status;
  string body;
  pointer local_1a8;
  undefined1 local_1a0 [384];
  long lVar6;
  
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar2);
  pcVar1 = *(code **)(lVar6 + 0x3f0);
  GVar3 = Utils::getGLenumForShaderStage(shader_stage);
  GVar4 = (*pcVar1)(GVar3);
  this->m_so_id = GVar4;
  dVar5 = (**(code **)(lVar6 + 0x800))();
  this_02 = (NegativeTest3 *)0x16955e1;
  glu::checkError(dVar5,"glCreateShader() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x2cd9);
  body._M_dataplus._M_p = (pointer)&body.field_2;
  body._M_string_length = 0;
  body.field_2._M_local_buf[0] = '\0';
  switch(*shader_stage) {
  case SHADER_STAGE_FIRST:
    getVertexShaderBody_abi_cxx11_((string *)local_1a0,this_02);
    break;
  case SHADER_STAGE_TESSELLATION_CONTROL:
    getTessellationControlShaderBody_abi_cxx11_((string *)local_1a0,this_02);
    break;
  case SHADER_STAGE_TESSELLATION_EVALUATION:
    getTessellationEvaluationShaderBody_abi_cxx11_((string *)local_1a0,this_02);
    break;
  case SHADER_STAGE_GEOMETRY:
    getGeometryShaderBody_abi_cxx11_((string *)local_1a0,this_02);
    break;
  case SHADER_STAGE_FRAGMENT:
    getFragmentShaderBody_abi_cxx11_((string *)local_1a0,this_02);
    break;
  default:
    this_01 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_01,"Unrecognized shader stage requested",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
               ,0x2cf3);
    __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  std::__cxx11::string::operator=((string *)&body,(string *)local_1a0);
  std::__cxx11::string::~string((string *)local_1a0);
  local_1a8 = body._M_dataplus._M_p;
  (**(code **)(lVar6 + 0x12b8))(this->m_so_id,1,&local_1a8,0);
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"glShaderSource() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x2cfa);
  compile_status = 0;
  (**(code **)(lVar6 + 0x248))(this->m_so_id);
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"glCompileShader() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x2d00);
  (**(code **)(lVar6 + 0xa70))(this->m_so_id,0x8b81,&compile_status);
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"glGetShaderiv() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x2d03);
  if (compile_status == 1) {
    local_1a0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    this_00 = (ostringstream *)(local_1a0 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::operator<<((ostream *)this_00,
                    "The following shader was expected to fail to compile but was accepted by the compiler:\n\n"
                   );
    std::operator<<((ostream *)this_00,body._M_dataplus._M_p);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    this->m_has_test_passed = false;
  }
  (**(code **)(lVar6 + 0x470))(this->m_so_id);
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"glDeleteShader() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x2d11);
  std::__cxx11::string::~string((string *)&body);
  return;
}

Assistant:

void NegativeTest3::executeTest(const Utils::_shader_stage& shader_stage)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Generate a new shader object */
	m_so_id = gl.createShader(Utils::getGLenumForShaderStage(shader_stage));
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader() call failed.");

	/* Assign body to the shader */
	std::string body;
	const char* body_raw_ptr = DE_NULL;

	switch (shader_stage)
	{
	case Utils::SHADER_STAGE_VERTEX:
		body = getVertexShaderBody();
		break;
	case Utils::SHADER_STAGE_TESSELLATION_CONTROL:
		body = getTessellationControlShaderBody();
		break;
	case Utils::SHADER_STAGE_TESSELLATION_EVALUATION:
		body = getTessellationEvaluationShaderBody();
		break;
	case Utils::SHADER_STAGE_GEOMETRY:
		body = getGeometryShaderBody();
		break;
	case Utils::SHADER_STAGE_FRAGMENT:
		body = getFragmentShaderBody();
		break;

	default:
	{
		TCU_FAIL("Unrecognized shader stage requested");
	}
	} /* switch (shader_stage) */

	body_raw_ptr = body.c_str();

	gl.shaderSource(m_so_id, 1 /* count */, &body_raw_ptr, DE_NULL /* length */);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() call failed.");

	/* Try to compile the shader */
	glw::GLint compile_status = 0;

	gl.compileShader(m_so_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCompileShader() call failed.");

	gl.getShaderiv(m_so_id, GL_COMPILE_STATUS, &compile_status);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderiv() call failed.");

	if (compile_status == GL_TRUE)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "The following shader was expected to fail to compile but was "
													   "accepted by the compiler:\n"
													   "\n"
						   << body.c_str() << tcu::TestLog::EndMessage;

		m_has_test_passed = false;
	}

	/* Good to release the shader at this point */
	gl.deleteShader(m_so_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glDeleteShader() call failed.");
}